

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall FIX::HttpServer::start(HttpServer *this)

{
  RuntimeError *this_00;
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  HttpServer *local_10;
  HttpServer *this_local;
  
  this->m_stop = false;
  local_10 = this;
  onConfigure(this,&this->m_settings);
  onInitialize(this,&this->m_settings);
  bVar1 = thread_spawn(startThread,this,&this->m_threadid);
  if (!bVar1) {
    this_00 = (RuntimeError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Unable to spawn thread",&local_31);
    RuntimeError::RuntimeError(this_00,&local_30);
    __cxa_throw(this_00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  return;
}

Assistant:

void HttpServer::start() EXCEPT ( ConfigError, RuntimeError )
{
  m_stop = false;
  onConfigure( m_settings );
  onInitialize( m_settings );

  if( !thread_spawn( &startThread, this, m_threadid ) )
    throw RuntimeError("Unable to spawn thread");
}